

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC::BasicRateTargetingSVC1TL3SLDynEnablTest
          (DatarateTestSVC *this)

{
  undefined1 uVar1;
  bool bVar2;
  __tuple_element_t<4UL,_tuple<const_CodecFactory_*,_TestMode,_int,_unsigned_int,_int>_> *p_Var3;
  long *in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int bitrate_array [2];
  I420VideoSource video;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffe84;
  double *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  Message *in_stack_fffffffffffffe98;
  int line;
  char *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffea8;
  Type type;
  uint in_stack_fffffffffffffeb0;
  undefined4 uVar6;
  undefined2 in_stack_fffffffffffffeb4;
  undefined1 in_stack_fffffffffffffeb6;
  undefined1 in_stack_fffffffffffffeb7;
  allocator *paVar7;
  AssertionResult local_118;
  Message *in_stack_fffffffffffffef8;
  AssertHelper *in_stack_ffffffffffffff00;
  AssertionResult local_f0;
  int local_dc;
  uint local_c4;
  HasNewFatalFailureHelper local_c0;
  undefined8 local_a8 [3];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [104];
  
  *(undefined4 *)(in_RDI + 0x1a) = 500;
  *(undefined4 *)((long)in_RDI + 0xd4) = 500;
  *(undefined4 *)((long)in_RDI + 0xcc) = 1000;
  *(undefined4 *)((long)in_RDI + 0x6c) = 0;
  *(undefined4 *)((long)in_RDI + 0xbc) = 0;
  *(undefined4 *)(in_RDI + 0x18) = 0x3f;
  *(undefined4 *)(in_RDI + 0x12) = 1;
  *(undefined4 *)(in_RDI + 0xd) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  paVar7 = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"niklas_640_480_30.yuv",paVar7);
  uVar5 = 400;
  uVar4 = 0;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)
             CONCAT17(in_stack_fffffffffffffeb7,
                      CONCAT16(in_stack_fffffffffffffeb6,
                               CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0))),
             in_stack_fffffffffffffea8,(uint)((ulong)in_stack_fffffffffffffea0 >> 0x20),
             (uint)in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
             (int)in_stack_fffffffffffffe98,(uint)in_RDI,(int)paVar7);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_a8[0] = 0x3e8000001f4;
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  ::GetParam();
  p_Var3 = std::get<4ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,unsigned_int,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                       *)0x7dc8c9);
  *(undefined4 *)(in_RDI + 0x17) = *(undefined4 *)((long)local_a8 + (long)*p_Var3 * 4);
  (**(code **)(*in_RDI + 0x40))();
  *(undefined4 *)(in_RDI + 0x9e) = 1;
  *(undefined4 *)((long)in_RDI + 0x4f4) = 3;
  *(uint *)(in_RDI + 0x9f) = *(uint *)(in_RDI + 0x17) >> 3;
  *(uint *)((long)in_RDI + 0x4fc) = (uint)((int)in_RDI[0x17] * 3) >> 3;
  *(uint *)(in_RDI + 0xa0) = *(uint *)(in_RDI + 0x17) >> 1 & 0x1fffffff;
  *(undefined4 *)(in_RDI + 0x30f) = 1;
  uVar1 = testing::internal::AlwaysTrue();
  type = (Type)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  if ((bool)uVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)
               CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffeb6,
                                       CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)
                                      )));
    in_stack_fffffffffffffeb6 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffeb6) {
      (**(code **)(in_RDI[3] + 0x10))(in_RDI + 3,local_68);
    }
    bVar2 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_c0);
    if (bVar2) {
      local_c4 = 2;
    }
    else {
      local_c4 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffe84,uVar5));
    type = (Type)((ulong)in_stack_fffffffffffffea8 >> 0x20);
    if (local_c4 == 0) {
      uVar6 = 0;
      for (local_dc = 0; local_dc < *(int *)((long)in_RDI + 0x4f4) + -1; local_dc = local_dc + 1) {
        testing::internal::CmpHelperGE<double,double>
                  ((char *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                   in_stack_fffffffffffffe88,(double *)CONCAT44(in_stack_fffffffffffffe84,uVar5));
        bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
        if (!bVar2) {
          testing::Message::Message
                    ((Message *)
                     CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffeb6,
                                             CONCAT24(in_stack_fffffffffffffeb4,uVar6))));
          in_stack_fffffffffffffea8 =
               (string *)
               testing::Message::operator<<
                         ((Message *)CONCAT44(in_stack_fffffffffffffe84,uVar5),
                          (char (*) [61])CONCAT44(in_stack_fffffffffffffe7c,uVar4));
          in_stack_fffffffffffffea0 =
               testing::AssertionResult::failure_message((AssertionResult *)0x7dcc1e);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)
                     CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffeb6,
                                             CONCAT24(in_stack_fffffffffffffeb4,uVar6))),
                     (Type)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_fffffffffffffea0,
                     (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),in_stack_fffffffffffffe90);
          testing::internal::AssertHelper::operator=
                    (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe84,uVar5));
          testing::Message::~Message((Message *)0x7dcc78);
        }
        local_c4 = (uint)!bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x7dccff);
        if (local_c4 != 0) goto LAB_007dceb6;
        testing::internal::CmpHelperLE<double,double>
                  ((char *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                   in_stack_fffffffffffffe88,(double *)CONCAT44(in_stack_fffffffffffffe84,uVar5));
        bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_118);
        if (!bVar2) {
          testing::Message::Message
                    ((Message *)
                     CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffeb6,
                                             CONCAT24(in_stack_fffffffffffffeb4,uVar6))));
          in_stack_fffffffffffffe98 =
               testing::Message::operator<<
                         ((Message *)CONCAT44(in_stack_fffffffffffffe84,uVar5),
                          (char (*) [63])CONCAT44(in_stack_fffffffffffffe7c,uVar4));
          in_stack_fffffffffffffe90 =
               testing::AssertionResult::failure_message((AssertionResult *)0x7dcdb4);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)
                     CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffeb6,
                                             CONCAT24(in_stack_fffffffffffffeb4,uVar6))),
                     (Type)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_fffffffffffffea0,
                     (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),in_stack_fffffffffffffe90);
          testing::internal::AssertHelper::operator=
                    (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe84,uVar5));
          testing::Message::~Message((Message *)0x7dce02);
        }
        local_c4 = (uint)!bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x7dce7a);
        if (local_c4 != 0) goto LAB_007dceb6;
      }
      local_c4 = 0;
      goto LAB_007dceb6;
    }
    in_stack_fffffffffffffeb0 = local_c4;
    if (local_c4 != 2) goto LAB_007dceb6;
  }
  line = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  testing::Message::Message
            ((Message *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffeb6,
                                     CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)))
            );
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffeb6,
                                     CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)))
             ,type,in_stack_fffffffffffffea0,line,in_stack_fffffffffffffe90);
  testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe84,uVar5));
  testing::Message::~Message((Message *)0x7dcaf6);
  local_c4 = 1;
LAB_007dceb6:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x7dcec3);
  return;
}

Assistant:

virtual void BasicRateTargetingSVC1TL3SLDynEnablTest() {
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 0;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 63;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    cfg_.g_error_resilient = 0;

    ::libaom_test::I420VideoSource video("niklas_640_480_30.yuv", 640, 480, 30,
                                         1, 0, 400);
    const int bitrate_array[2] = { 500, 1000 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    number_temporal_layers_ = 1;
    number_spatial_layers_ = 3;
    target_layer_bitrate_[0] = 1 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[1] = 3 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[2] = 4 * cfg_.rc_target_bitrate / 8;
    dynamic_enable_disable_mode_ = 1;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    // No need to check RC on top layer which is disabled part of the time.
    for (int i = 0; i < number_spatial_layers_ - 1; i++) {
      ASSERT_GE(effective_datarate_tl[i], target_layer_bitrate_[i] * 0.80)
          << " The datarate for the file is lower than target by too much!";
      ASSERT_LE(effective_datarate_tl[i], target_layer_bitrate_[i] * 1.38)
          << " The datarate for the file is greater than target by too much!";
    }
  }